

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

void wasm::printElement(ostream *os,Element *elem,int depth)

{
  char cVar1;
  Element *pEVar2;
  long lVar3;
  Element *elem_00;
  char *pcVar4;
  Element *pEVar5;
  int iVar6;
  RandomElement<wasm::RandomLattice> *e;
  Element *pEVar7;
  
  pEVar2 = (Element *)
           (elem->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
           super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
           _M_head_impl;
  elem_00 = (Element *)0x0;
  if ((pEVar2 != (Element *)0x0) &&
     (*(char *)&pEVar2[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                super__Tuple_impl<1UL,_void_(*)(void_*)> == '\0')) {
    elem_00 = pEVar2;
  }
  if (elem_00 != (Element *)0x0) {
    printFullElement(os,elem_00,depth);
    return;
  }
  iVar6 = depth;
  if (0 < depth) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  pEVar7 = (Element *)
           (elem->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
           super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
           _M_head_impl;
  pEVar5 = (Element *)0x0;
  if ((pEVar7 != (Element *)0x0) &&
     (*(char *)&pEVar7[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                super__Tuple_impl<1UL,_void_(*)(void_*)> == '\x01')) {
    pEVar5 = pEVar7;
  }
  if (pEVar5 == (Element *)0x0) {
    pEVar5 = (Element *)0x0;
    if ((pEVar7 != (Element *)0x0) &&
       (*(char *)&pEVar7[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Tuple_impl<1UL,_void_(*)(void_*)> == '\x02')) {
      pEVar5 = pEVar7;
    }
    if (pEVar5 == (Element *)0x0) {
      pEVar5 = (Element *)0x0;
      if ((pEVar7 != (Element *)0x0) &&
         (*(char *)&pEVar7[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                    super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                    super__Tuple_impl<1UL,_void_(*)(void_*)> == '\x03')) {
        pEVar5 = pEVar7;
      }
      if (pEVar5 == (Element *)0x0) {
        pEVar5 = (Element *)0x0;
        if ((pEVar7 != (Element *)0x0) &&
           (*(char *)&pEVar7[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                      super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                      super__Tuple_impl<1UL,_void_(*)(void_*)> == '\x04')) {
          pEVar5 = pEVar7;
        }
        if (pEVar5 == (Element *)0x0) {
          pEVar5 = (Element *)0x0;
          if ((pEVar7 != (Element *)0x0) &&
             (*(char *)&pEVar7[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                        super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                        super__Tuple_impl<1UL,_void_(*)(void_*)> == '\x05')) {
            pEVar5 = pEVar7;
          }
          if (pEVar5 == (Element *)0x0) {
            pEVar5 = (Element *)0x0;
            if ((pEVar7 != (Element *)0x0) &&
               (*(char *)&pEVar7[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                          super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                          super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                          super__Tuple_impl<1UL,_void_(*)(void_*)> == '\x06')) {
              pEVar5 = pEVar7;
            }
            if (pEVar5 == (Element *)0x0) {
              wasm::handle_unreachable
                        ("unexpected element",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
                         ,499);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"SharedPath(\n",0xc);
            printElement(os,*(Element **)
                             &(pEVar5->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                              super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                              super__Tuple_impl<1UL,_void_(*)(void_*)>,depth + 1);
            if (0 < depth) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
                depth = depth + -1;
              } while (depth != 0);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,"Tuple(\n",7);
            printElement(os,pEVar5 + 1,depth + 1);
            printElement(os,pEVar5,depth + 1);
            if (0 < depth) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
                depth = depth + -1;
              } while (depth != 0);
            }
          }
          goto LAB_00198b9b;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"Vector[\n",8);
        pEVar7 = *(Element **)
                  &(pEVar5->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                   super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                   super__Tuple_impl<1UL,_void_(*)(void_*)>;
        pEVar5 = (Element *)
                 (pEVar5->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                 super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_void_*,_false>._M_head_impl;
        if (pEVar7 != pEVar5) {
          do {
            printElement(os,pEVar7,depth + 1);
            pEVar7 = pEVar7 + 1;
          } while (pEVar7 != pEVar5);
        }
        if (0 < depth) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
            depth = depth + -1;
          } while (depth != 0);
        }
        pcVar4 = "]\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,"Array[\n",7);
        printElement(os,pEVar5,depth + 1);
        printElement(os,pEVar5 + 1,depth + 1);
        if (0 < depth) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
            depth = depth + -1;
          } while (depth != 0);
        }
LAB_00198b9b:
        pcVar4 = ")\n";
      }
      lVar3 = 2;
      goto LAB_00198bb8;
    }
    if (*(char *)&pEVar5[1].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Tuple_impl<1UL,_void_(*)(void_*)>.
                  super__Head_base<1UL,_void_(*)(void_*),_false> != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(os,"Lifted(\n",8);
      printElement(os,pEVar5,depth + 1);
      if (0 < depth) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
          depth = depth + -1;
        } while (depth != 0);
      }
      goto LAB_00198b9b;
    }
    pcVar4 = "lift bot\n";
  }
  else {
    cVar1 = *(char *)((long)&(pEVar5->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                             super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                             super__Tuple_impl<1UL,_void_(*)(void_*)> + 4);
    if (cVar1 == '\x02') {
      pcVar4 = "flat top\n";
    }
    else {
      if (cVar1 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(os,"flat ",5);
        os = std::ostream::_M_insert<unsigned_long>((ulong)os);
        pcVar4 = "\n";
        lVar3 = 1;
        goto LAB_00198bb8;
      }
      pcVar4 = "flat bot\n";
    }
  }
  lVar3 = 9;
LAB_00198bb8:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
  return;
}

Assistant:

void printElement(std::ostream& os,
                  const typename RandomLattice::Element& elem,
                  int depth = 0) {
  if (const auto* e =
        std::get_if<typename RandomFullLattice::Element>(&*elem)) {
    printFullElement(os, *e, depth);
    return;
  }

  indent(os, depth);

  if (const auto* e = std::get_if<typename Flat<uint32_t>::Element>(&*elem)) {
    if (e->isBottom()) {
      os << "flat bot\n";
    } else if (e->isTop()) {
      os << "flat top\n";
    } else {
      os << "flat " << *e->getVal() << "\n";
    }
  } else if (const auto* e =
               std::get_if<typename Lift<RandomLattice>::Element>(&*elem)) {
    if (e->isBottom()) {
      os << "lift bot\n";
    } else {
      os << "Lifted(\n";
      printElement(os, **e, depth + 1);
      indent(os, depth);
      os << ")\n";
    }
  } else if (const auto* e =
               std::get_if<typename ArrayLattice::Element>(&*elem)) {
    os << "Array[\n";
    printElement(os, e->front(), depth + 1);
    printElement(os, e->back(), depth + 1);
    indent(os, depth);
    os << ")\n";
  } else if (const auto* vec =
               std::get_if<typename Vector<RandomLattice>::Element>(&*elem)) {
    os << "Vector[\n";
    for (const auto& e : *vec) {
      printElement(os, e, depth + 1);
    }
    indent(os, depth);
    os << "]\n";
  } else if (const auto* e =
               std::get_if<typename TupleLattice::Element>(&*elem)) {
    os << "Tuple(\n";
    const auto& [first, second] = *e;
    printElement(os, first, depth + 1);
    printElement(os, second, depth + 1);
    indent(os, depth);
    os << ")\n";
  } else if (const auto* e =
               std::get_if<typename SharedPath<RandomLattice>::Element>(
                 &*elem)) {
    os << "SharedPath(\n";
    printElement(os, **e, depth + 1);
    indent(os, depth);
    os << ")\n";
  } else {
    WASM_UNREACHABLE("unexpected element");
  }
}